

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::print_param_error
          (CmdlineParser *this,int argc,char **argv,Argument *arg,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  char *pcVar3;
  string local_50;
  
  std::operator<<(os,"Error: argument ");
  if (argc != 0) {
    poVar2 = std::operator<<(os,'\"');
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2,'\"');
  }
  poVar2 = std::operator<<(os," for ");
  iVar1 = (*arg->_vptr_Argument[2])(arg);
  poVar2 = std::operator<<(poVar2,(char *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2," parameter ");
  Argument::param_text_abi_cxx11_(&local_50,arg);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  pcVar3 = " is invalid!";
  if (argc == 0) {
    pcVar3 = " is missing!";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_50);
  print_usage(this,os);
  return;
}

Assistant:

void CmdlineParser::print_param_error(
    int argc, const char* const* argv, const Argument* arg, std::ostream& os) {
    os << "Error: argument ";
    if (argc != 0)
        os << '"' << argv[0] << '"';

    os << " for " << arg->type_name() << " parameter " << arg->param_text()
       << (argc == 0 ? " is missing!" : " is invalid!") << std::endl
       << std::endl;

    print_usage(os);
}